

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O0

void __thiscall tvm::runtime::NDArray::CopyTo(NDArray *this,DLTensor *other)

{
  ostringstream *poVar1;
  ostream *poVar2;
  LogMessageFatal local_1a0;
  DLTensor *local_18;
  DLTensor *other_local;
  NDArray *this_local;
  
  local_18 = other;
  other_local = (DLTensor *)this;
  if (this->data_ == (Container *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/ndarray.h"
               ,0x16d);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a0);
    poVar2 = std::operator<<((ostream *)poVar1,"Check failed: data_ != nullptr");
    std::operator<<(poVar2,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  CopyFromTo(&this->data_->dl_tensor,local_18,(TVMStreamHandle)0x0);
  return;
}

Assistant:

inline void NDArray::CopyTo(DLTensor *other) const {
  CHECK(data_ != nullptr);
  CopyFromTo(&(data_->dl_tensor), other);
}